

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  TValue *pTVar2;
  int iVar3;
  ulong uVar4;
  GCstr *pGVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  int status;
  ptrdiff_t ef;
  uint8_t oldh;
  global_State *g;
  TValue *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  long local_98;
  
  uVar4 = (ulong)(in_RDI->glref).ptr32;
  bVar1 = *(byte *)(uVar4 + 0x109);
  if (in_ECX == 0) {
    local_98 = 0;
  }
  else {
    in_stack_ffffffffffffff58 = index2adr_stack(in_RDI,in_ECX);
    local_98 = (long)in_stack_ffffffffffffff58 - (ulong)(in_RDI->stack).ptr32;
  }
  if (*(int *)(uVar4 + 400) != 0) {
    pTVar2 = in_RDI->top;
    in_RDI->top = pTVar2 + 1;
    pGVar5 = lj_err_str((lua_State *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (ErrMsg)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    (pTVar2->u32).lo = (uint32_t)pGVar5;
    (pTVar2->field_2).it = 0xfffffffb;
    if (*(long *)(uVar4 + 0x178) != 0) {
      (**(code **)(uVar4 + 0x178))(in_RDI);
    }
    exit(1);
  }
  *(uint *)(uVar4 + 0x31c) = *(uint *)(uVar4 + 0x31c) & 0xffffffef;
  iVar3 = lj_vm_pcall(in_RDI,in_RDI->top + -(long)in_ESI,in_EDX + 1,local_98);
  if (iVar3 != 0) {
    *(byte *)(uVar4 + 0x109) = *(byte *)(uVar4 + 0x109) & 0xf | bVar1 & 0xf0;
  }
  return iVar3;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  lj_checkapi_slot(nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = index2adr_stack(L, errfunc);
    ef = savestack(L, o);
  }
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  status = lj_vm_pcall(L, api_call_base(L, nargs), nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}